

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

ulong __thiscall CTcDataStream::reserve(CTcDataStream *this,size_t len)

{
  ulong uVar1;
  CTcDataStream *in_RSI;
  long in_RDI;
  size_t cur;
  ulong ret;
  CTcDataStream *in_stack_ffffffffffffffe0;
  CTcDataStream *local_10;
  
  uVar1 = *(ulong *)(in_RDI + 8);
  local_10 = in_RSI;
  if (*(CTcDataStream **)(in_RDI + 0x20) < in_RSI) {
    do {
      if (*(long *)(in_RDI + 0x20) == 0) {
        alloc_page(in_stack_ffffffffffffffe0);
      }
      in_stack_ffffffffffffffe0 = local_10;
      if (*(CTcDataStream **)(in_RDI + 0x20) < local_10) {
        in_stack_ffffffffffffffe0 = *(CTcDataStream **)(in_RDI + 0x20);
      }
      *(long *)(in_RDI + 8) =
           (long)&in_stack_ffffffffffffffe0->_vptr_CTcDataStream + *(long *)(in_RDI + 8);
      *(long *)(in_RDI + 0x18) =
           (long)&in_stack_ffffffffffffffe0->_vptr_CTcDataStream + *(long *)(in_RDI + 0x18);
      *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) - (long)in_stack_ffffffffffffffe0;
      local_10 = (CTcDataStream *)((long)local_10 - (long)in_stack_ffffffffffffffe0);
    } while (local_10 != (CTcDataStream *)0x0);
  }
  else {
    *(long *)(in_RDI + 8) = (long)&in_RSI->_vptr_CTcDataStream + *(long *)(in_RDI + 8);
    *(long *)(in_RDI + 0x18) = (long)&in_RSI->_vptr_CTcDataStream + *(long *)(in_RDI + 0x18);
    *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) - (long)in_RSI;
  }
  return uVar1;
}

Assistant:

ulong CTcDataStream::reserve(size_t len)
{
    ulong ret;

    /* we'll always return the offset current before the call */
    ret = ofs_;
    
    /* if we have space on the current page, it's easy */
    if (len <= rem_)
    {
        /* advance the output pointers */
        ofs_ += len;
        wp_ += len;
        rem_ -= len;
    }
    else
    {
        /* keep going until we satisfy the request */
        do
        {
            size_t cur;

            /* if necessary, allocate more memory */
            if (rem_ == 0)
                alloc_page();

            /* limit this chunk to the space remaining on the current page */
            cur = len;
            if (cur > rem_)
                cur = rem_;

            /* skip past this chunk */
            ofs_ += cur;
            wp_ += cur;
            rem_ -= cur;
            len -= cur;

        } while (len != 0);
    }

    /* return the starting offset */
    return ret;
}